

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeBlock * __thiscall Parser::ParseBlock<true>(Parser *this,LabelId *pLabelId)

{
  BlockInfoStack *pBVar1;
  ScopeType SVar2;
  ParseNodeVar *pPVar3;
  IdentPtr pid;
  PidRefStack *this_00;
  ParseNodePtr *ppnodeList;
  PidRefStack *ref;
  ParseNodePtr pnode;
  BlockInfoStack *outerBlockInfo;
  ParseNodePtr *ppnodeExprScopeSave;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodeBlock *pnodeBlock;
  LabelId *pLabelId_local;
  Parser *this_local;
  
  ppnodeScopeSave = (ParseNodePtr *)0x0;
  ppnodeExprScopeSave = (ParseNodePtr *)0x0;
  outerBlockInfo = (BlockInfoStack *)0x0;
  pnodeBlock = (ParseNodeBlock *)pLabelId;
  pLabelId_local = (LabelId *)this;
  ppnodeScopeSave = (ParseNodePtr *)StartParseBlock<true>(this,Regular,ScopeType_Block,pLabelId);
  pBVar1 = this->m_currentBlockInfo->pBlockInfoOuter;
  if ((((pBVar1 != (BlockInfoStack *)0x0) && (pBVar1->pnodeBlock != (ParseNodeBlock *)0x0)) &&
      (pBVar1->pnodeBlock->scope != (Scope *)0x0)) &&
     (SVar2 = Scope::GetScopeType(pBVar1->pnodeBlock->scope), SVar2 == ScopeType_CatchParamPattern))
  {
    ref = (PidRefStack *)this->m_currentBlockInfo->pBlockInfoOuter->pnodeBlock->pnodeLexVars;
    while (ref != (PidRefStack *)0x0) {
      pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)ref);
      pid = Symbol::GetPid(pPVar3->sym);
      this_00 = PushPidRef(this,pid);
      pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)ref);
      PidRefStack::SetSym(this_00,pPVar3->sym);
      pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)ref);
      ref = (PidRefStack *)pPVar3->pnodeNext;
    }
  }
  ChkCurTok(this,0x52,-0x7ff5fc10);
  PushFuncBlockScope(this,(ParseNodeBlock *)ppnodeScopeSave,&ppnodeExprScopeSave,
                     (ParseNodePtr **)&outerBlockInfo);
  ParseStmtList<true>(this,ppnodeScopeSave + 4,(ParseNodePtr **)0x0,SM_NotUsed,false,(bool *)0x0);
  PopFuncBlockScope(this,ppnodeExprScopeSave,(ParseNodePtr *)outerBlockInfo);
  FinishParseBlock(this,(ParseNodeBlock *)ppnodeScopeSave,true);
  ChkCurTok(this,0x53,-0x7ff5fc0f);
  return (ParseNodeBlock *)ppnodeScopeSave;
}

Assistant:

ParseNodeBlock * Parser::ParseBlock(LabelId* pLabelId)
{
    ParseNodeBlock * pnodeBlock = nullptr;
    ParseNodePtr *ppnodeScopeSave = nullptr;
    ParseNodePtr *ppnodeExprScopeSave = nullptr;

    pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Regular, ScopeType_Block, pLabelId);

    BlockInfoStack* outerBlockInfo = m_currentBlockInfo->pBlockInfoOuter;
    if (outerBlockInfo != nullptr && outerBlockInfo->pnodeBlock != nullptr
        && outerBlockInfo->pnodeBlock->scope != nullptr
        && outerBlockInfo->pnodeBlock->scope->GetScopeType() == ScopeType_CatchParamPattern)
    {
        // If we are parsing the catch block then destructured params can have let declarations. Let's add them to the new block.
        for (ParseNodePtr pnode = m_currentBlockInfo->pBlockInfoOuter->pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            PidRefStack* ref = PushPidRef(pnode->AsParseNodeVar()->sym->GetPid());
            ref->SetSym(pnode->AsParseNodeVar()->sym);
        }
    }

    ChkCurTok(tkLCurly, ERRnoLcurly);
    ParseNodePtr * ppnodeList = nullptr;
    if (buildAST)
    {
        PushFuncBlockScope(pnodeBlock, &ppnodeScopeSave, &ppnodeExprScopeSave);
        ppnodeList = &pnodeBlock->pnodeStmt;
    }

    ParseStmtList<buildAST>(ppnodeList);

    if (buildAST)
    {
        PopFuncBlockScope(ppnodeScopeSave, ppnodeExprScopeSave);
    }

    FinishParseBlock(pnodeBlock);

    ChkCurTok(tkRCurly, ERRnoRcurly);

    return pnodeBlock;
}